

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_process_ref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  char *argv [3];
  size_t exepath_size;
  uv_process_t h;
  char exepath [256];
  undefined1 auStack_288 [136];
  char *pcStack_200;
  undefined8 local_1f8;
  size_t local_1e8;
  undefined1 local_1e0 [48];
  uv_stdio_container_t *puStack_1b0;
  undefined1 local_1a8 [8];
  undefined1 local_1a0 [400];
  
  local_1f8 = 0;
  auStack_288._128_8_ = (uv_loop_t *)0x0;
  pcStack_200 = "spawn_helper4";
  local_1e0._24_8_ = (char **)0x0;
  local_1e0._32_8_ = (uv_close_cb)0x0;
  local_1e0._40_8_ = (void *)0x0;
  puStack_1b0 = (uv_stdio_container_t *)0x0;
  local_1a8 = (undefined1  [8])0x0;
  local_1e8 = 0x100;
  puVar3 = (uv_loop_t *)(local_1a0 + 0x88);
  auStack_288._120_8_ = (void *)0x1675ab;
  iVar1 = uv_exepath((char *)puVar3,&local_1e8);
  if (iVar1 == 0) {
    local_1e0._0_8_ = (__pthread_internal_list *)0x0;
    auStack_288._120_8_ = (void *)0x1675d2;
    auStack_288._128_8_ = puVar3;
    local_1e0._8_8_ = puVar3;
    local_1e0._16_8_ = (uv_loop_t *)(auStack_288 + 0x80);
    puVar2 = uv_default_loop();
    auStack_288._120_8_ = (void *)0x1675e2;
    iVar1 = uv_spawn(puVar2,(uv_process_t *)local_1a0,(uv_process_options_t *)local_1e0);
    if (iVar1 != 0) goto LAB_00167663;
    puVar3 = (uv_loop_t *)local_1a0;
    auStack_288._120_8_ = (void *)0x1675f3;
    uv_unref((uv_handle_t *)puVar3);
    auStack_288._120_8_ = (void *)0x1675f8;
    puVar2 = uv_default_loop();
    auStack_288._120_8_ = (void *)0x167602;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_288._120_8_ = (void *)0x16760f;
    iVar1 = uv_process_kill((uv_process_t *)puVar3,0xf);
    if (iVar1 != 0) goto LAB_00167668;
    auStack_288._120_8_ = (void *)0x16761d;
    do_close(local_1a0);
    auStack_288._120_8_ = (void *)0x167622;
    puVar3 = uv_default_loop();
    auStack_288._120_8_ = (void *)0x167636;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_288._120_8_ = (void *)0x167640;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_288._120_8_ = (void *)0x167645;
    puVar2 = uv_default_loop();
    auStack_288._120_8_ = (void *)0x16764d;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    auStack_288._120_8_ = (void *)0x167663;
    run_test_process_ref_cold_1();
LAB_00167663:
    auStack_288._120_8_ = (void *)0x167668;
    run_test_process_ref_cold_2();
LAB_00167668:
    auStack_288._120_8_ = (void *)0x16766d;
    run_test_process_ref_cold_3();
  }
  auStack_288._120_8_ = run_test_has_ref;
  run_test_process_ref_cold_4();
  auStack_288._120_8_ = puVar3;
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)auStack_288;
  uv_idle_init(puVar2,(uv_idle_t *)puVar3);
  uv_ref((uv_handle_t *)puVar3);
  iVar1 = uv_has_ref((uv_handle_t *)puVar3);
  if (iVar1 == 1) {
    puVar3 = (uv_loop_t *)auStack_288;
    uv_unref((uv_handle_t *)puVar3);
    iVar1 = uv_has_ref((uv_handle_t *)puVar3);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00167706;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_00167706:
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(process_ref) {
  /* spawn_helper4 blocks indefinitely. */
  char *argv[] = { NULL, "spawn_helper4", NULL };
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[256];
  uv_process_t h;
  int r;

  memset(&options, 0, sizeof(options));
  exepath_size = sizeof(exepath);

  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  argv[0] = exepath;
  options.file = exepath;
  options.args = argv;
  options.exit_cb = NULL;

  r = uv_spawn(uv_default_loop(), &h, &options);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  r = uv_process_kill(&h, /* SIGTERM */ 15);
  ASSERT(r == 0);

  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}